

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

void MpiProvideWriterDataToReader
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,int writerCohortSize,
               CP_PeerCohort PeerCohort,void **providedWriterInfo_v)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  
  bVar6 = 0;
  *(CP_PeerCohort *)((long)RS_Stream_v + 0x20) = PeerCohort;
  *(int *)((long)RS_Stream_v + 0x18) = writerCohortSize;
  pvVar1 = malloc((long)writerCohortSize * 0x50);
  *(void **)((long)RS_Stream_v + 0x80) = pvVar1;
  pvVar1 = malloc((long)writerCohortSize * 8);
  *(void **)((long)RS_Stream_v + 0x88) = pvVar1;
  if (0 < writerCohortSize) {
    uVar3 = 0;
    do {
      puVar4 = (undefined8 *)providedWriterInfo_v[uVar3];
      puVar5 = (undefined8 *)(uVar3 * 0x50 + *(long *)((long)RS_Stream_v + 0x80));
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
      }
      *(undefined **)(*(long *)((long)RS_Stream_v + 0x88) + uVar3 * 8) = &ompi_mpi_comm_null;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)writerCohortSize);
  }
  return;
}

Assistant:

static void MpiProvideWriterDataToReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v,
                                         int writerCohortSize, CP_PeerCohort PeerCohort,
                                         void **providedWriterInfo_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;
    MpiWriterContactInfo *providedWriterInfo = (MpiWriterContactInfo *)providedWriterInfo_v;

    StreamRS->Link.PeerCohort = PeerCohort;
    StreamRS->Link.CohortSize = writerCohortSize;

    /* * Copy of writer contact information (original will not be preserved) */
    StreamRS->CohortWriterInfo = malloc(sizeof(struct _MpiWriterContactInfo) * writerCohortSize);
    StreamRS->CohortMpiComms = malloc(sizeof(MPI_Comm) * writerCohortSize);
    for (int i = 0; i < writerCohortSize; i++)
    {
        memcpy(&StreamRS->CohortWriterInfo[i], providedWriterInfo[i],
               sizeof(struct _MpiWriterContactInfo));
        StreamRS->CohortMpiComms[i] = MPI_COMM_NULL;
    }
}